

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

EdwardsPoint * ecc_edwards_add(EdwardsPoint *P,EdwardsPoint *Q)

{
  EdwardsCurve *ec;
  EdwardsPoint *pEVar1;
  mp_int *y;
  mp_int *y_00;
  mp_int *y_01;
  mp_int *x;
  mp_int *x_00;
  mp_int *y_02;
  mp_int *y_03;
  mp_int *y_04;
  mp_int *x_01;
  mp_int *y_05;
  mp_int *x_02;
  mp_int *y_06;
  mp_int *y_07;
  mp_int *y_08;
  mp_int *pmVar2;
  
  ec = P->ec;
  if (Q->ec == ec) {
    pEVar1 = ecc_edwards_point_new_empty(ec);
    y = monty_mul(ec->mc,P->X,Q->X);
    y_00 = monty_mul(ec->mc,P->Y,Q->Y);
    y_01 = monty_mul(ec->mc,P->T,Q->T);
    x = monty_mul(ec->mc,P->Z,Q->Z);
    x_00 = monty_add(ec->mc,P->X,P->Y);
    y_02 = monty_add(ec->mc,Q->X,Q->Y);
    y_03 = monty_mul(ec->mc,ec->a,y);
    y_04 = monty_mul(ec->mc,ec->d,y_01);
    x_01 = monty_mul(ec->mc,x_00,y_02);
    y_05 = monty_add(ec->mc,y,y_00);
    x_02 = monty_sub(ec->mc,x_01,y_05);
    y_06 = monty_sub(ec->mc,x,y_04);
    y_07 = monty_add(ec->mc,x,y_04);
    y_08 = monty_sub(ec->mc,y_00,y_03);
    pmVar2 = monty_mul(ec->mc,x_02,y_06);
    pEVar1->X = pmVar2;
    pmVar2 = monty_mul(ec->mc,y_06,y_07);
    pEVar1->Z = pmVar2;
    pmVar2 = monty_mul(ec->mc,y_07,y_08);
    pEVar1->Y = pmVar2;
    pmVar2 = monty_mul(ec->mc,y_08,x_02);
    pEVar1->T = pmVar2;
    mp_free(y);
    mp_free(y_00);
    mp_free(y_01);
    mp_free(x);
    mp_free(x_00);
    mp_free(y_02);
    mp_free(y_03);
    mp_free(y_04);
    mp_free(x_01);
    mp_free(y_05);
    mp_free(x_02);
    mp_free(y_06);
    mp_free(y_07);
    mp_free(y_08);
    return pEVar1;
  }
  __assert_fail("Q->ec == ec",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x407,"EdwardsPoint *ecc_edwards_add(EdwardsPoint *, EdwardsPoint *)");
}

Assistant:

EdwardsPoint *ecc_edwards_add(EdwardsPoint *P, EdwardsPoint *Q)
{
    EdwardsCurve *ec = P->ec;
    assert(Q->ec == ec);

    EdwardsPoint *S = ecc_edwards_point_new_empty(ec);

    /*
     * The affine rule for Edwards addition of (x1,y1) and (x2,y2) is
     *
     *   x_out = (x1 y2 +   y1 x2) / (1 + d x1 x2 y1 y2)
     *   y_out = (y1 y2 - a x1 x2) / (1 - d x1 x2 y1 y2)
     *
     * The formulae below are listed as 'add-2008-hwcd' in
     * https://hyperelliptic.org/EFD/g1p/auto-twisted-extended.html
     *
     * and if you undo the careful optimisation to find out what
     * they're actually computing, it comes out to
     *
     *   X_out = (X1 Y2 +   Y1 X2) (Z1 Z2 - d T1 T2)
     *   Y_out = (Y1 Y2 - a X1 X2) (Z1 Z2 + d T1 T2)
     *   Z_out = (Z1 Z2 - d T1 T2) (Z1 Z2 + d T1 T2)
     *   T_out = (X1 Y2 +   Y1 X2) (Y1 Y2 - a X1 X2)
     */
    mp_int *PxQx = monty_mul(ec->mc, P->X, Q->X);
    mp_int *PyQy = monty_mul(ec->mc, P->Y, Q->Y);
    mp_int *PtQt = monty_mul(ec->mc, P->T, Q->T);
    mp_int *PzQz = monty_mul(ec->mc, P->Z, Q->Z);
    mp_int *Psum = monty_add(ec->mc, P->X, P->Y);
    mp_int *Qsum = monty_add(ec->mc, Q->X, Q->Y);
    mp_int *aPxQx = monty_mul(ec->mc, ec->a, PxQx);
    mp_int *dPtQt = monty_mul(ec->mc, ec->d, PtQt);
    mp_int *sumprod = monty_mul(ec->mc, Psum, Qsum);
    mp_int *xx_p_yy = monty_add(ec->mc, PxQx, PyQy);
    mp_int *E = monty_sub(ec->mc, sumprod, xx_p_yy);
    mp_int *F = monty_sub(ec->mc, PzQz, dPtQt);
    mp_int *G = monty_add(ec->mc, PzQz, dPtQt);
    mp_int *H = monty_sub(ec->mc, PyQy, aPxQx);
    S->X = monty_mul(ec->mc, E, F);
    S->Z = monty_mul(ec->mc, F, G);
    S->Y = monty_mul(ec->mc, G, H);
    S->T = monty_mul(ec->mc, H, E);

    mp_free(PxQx);
    mp_free(PyQy);
    mp_free(PtQt);
    mp_free(PzQz);
    mp_free(Psum);
    mp_free(Qsum);
    mp_free(aPxQx);
    mp_free(dPtQt);
    mp_free(sumprod);
    mp_free(xx_p_yy);
    mp_free(E);
    mp_free(F);
    mp_free(G);
    mp_free(H);

    return S;
}